

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O1

void __thiscall lzham::task_pool::deinit(task_pool *this)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  if (this->m_num_threads != 0) {
    join(this);
    LOCK();
    this->m_exit_flag = 1;
    UNLOCK();
    if ((ulong)this->m_num_threads != 0) {
      lVar3 = (ulong)this->m_num_threads + 1;
      do {
        iVar1 = sem_post((sem_t *)&this->m_tasks_available);
        if (iVar1 != 0) {
          lzham_fail("\"semaphore: sem_post() or sem_post_multiple() failed\"",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                     ,0x3b);
          break;
        }
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    if (this->m_num_threads != 0) {
      uVar2 = 0;
      do {
        pthread_join(this->m_threads[uVar2],(void **)0x0);
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->m_num_threads);
    }
    this->m_num_threads = 0;
    LOCK();
    this->m_exit_flag = 0;
    UNLOCK();
  }
  iVar1 = pthread_spin_lock((pthread_spinlock_t *)this);
  if (iVar1 != 0) {
    lzham_fail("\"spinlock: pthread_spin_lock() failed\"",
               "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
               ,0x72);
  }
  (this->m_task_stack).m_top = 0;
  iVar1 = pthread_spin_unlock((pthread_spinlock_t *)this);
  if (iVar1 != 0) {
    lzham_fail("\"spinlock: pthread_spin_unlock() failed\"",
               "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
               ,0x7a);
  }
  this->m_num_outstanding_tasks = 0;
  return;
}

Assistant:

void task_pool::deinit()
   {
      if (m_num_threads)
      {
         join();

         atomic_exchange32(&m_exit_flag, true);

         m_tasks_available.release(m_num_threads);

         for (uint i = 0; i < m_num_threads; i++)
            pthread_join(m_threads[i], NULL);

         m_num_threads = 0;

         atomic_exchange32(&m_exit_flag, false);
      }

      m_task_stack.clear();
      m_num_outstanding_tasks = 0;
   }